

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

TLVWriter * __thiscall
ASDCP::MXF::TLVWriter::WriteUi16(TLVWriter *this,MDDEntry *Entry,ui16_t *value)

{
  uint uVar1;
  ushort *in_RCX;
  Result_t result;
  TLVWriter local_88;
  
  if (in_RCX == (ushort *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  WriteTag(&local_88,Entry);
  if (-1 < (int)local_88.super_MemIOWriter.m_p) {
    if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)*(uint *)(Entry->ul + 0xc) + 2) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_001a3bd3;
    }
    *(undefined2 *)(*(long *)Entry->ul + (ulong)*(uint *)(Entry->ul + 0xc)) = 0x200;
    uVar1 = *(int *)(Entry->ul + 0xc) + 2;
    *(uint *)(Entry->ul + 0xc) = uVar1;
    if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)uVar1 + 2) {
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_001a3bd3;
    }
    *(ushort *)(*(long *)Entry->ul + (ulong)uVar1) = *in_RCX << 8 | *in_RCX >> 8;
    *(int *)(Entry->ul + 0xc) = *(int *)(Entry->ul + 0xc) + 2;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&local_88);
LAB_001a3bd3:
  Kumu::Result_t::~Result_t((Result_t *)&local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteUi16(const MDDEntry& Entry, ui16_t* value)
{
  ASDCP_TEST_NULL(value);
  Result_t result = WriteTag(Entry);

  if ( KM_SUCCESS(result) )
    {
      if ( ! MemIOWriter::WriteUi16BE(sizeof(ui16_t)) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
      if ( ! MemIOWriter::WriteUi16BE(*value) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  return result;
}